

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  float logMax;
  int i_1;
  int offset_1;
  int l_1;
  float oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  float max;
  int k;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  float local_2c;
  int local_28;
  
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x14); local_28 = local_28 + 1) {
    local_2c = 0.0;
    iVar1 = local_28 * *(int *)(in_RDI + 0x2c);
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
      local_38 = local_34 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar1;
      for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x24); local_3c = local_3c + 1) {
        if (local_2c < *(float *)(in_RSI + (long)local_38 * 4)) {
          local_2c = *(float *)(in_RSI + (long)local_38 * 4);
        }
        local_38 = local_38 + 1;
      }
    }
    if ((local_2c == 0.0) && (!NAN(local_2c))) {
      local_2c = 1.0;
    }
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x34); local_44 = local_44 + 1) {
      local_48 = local_44 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar1;
      for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x24); local_4c = local_4c + 1) {
        *(float *)(in_RSI + (long)local_48 * 4) =
             (1.0 / local_2c) * *(float *)(in_RSI + (long)local_48 * 4);
        local_48 = local_48 + 1;
      }
    }
    if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
      *(float *)(in_RDX + (long)local_28 * 4) = local_2c;
      if (in_RCX != 0) {
        dVar2 = log((double)local_2c);
        *(float *)(in_RCX + (long)local_28 * 4) =
             (float)((double)*(float *)(in_RCX + (long)local_28 * 4) + dVar2);
      }
    }
    else {
      dVar2 = log((double)local_2c);
      *(float *)(in_RDX + (long)local_28 * 4) = (float)dVar2;
      if (in_RCX != 0) {
        *(float *)(in_RCX + (long)local_28 * 4) =
             (float)dVar2 + *(float *)(in_RCX + (long)local_28 * 4);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}